

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::SwapFieldHelper::SwapNonInlinedStrings<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong *puVar4;
  Arena *lhs_arena;
  Arena *rhs_arena;
  ReflectionSchema *this;
  
  this = &r->schema_;
  uVar2 = ReflectionSchema::GetFieldOffset(this,field);
  uVar3 = ReflectionSchema::GetFieldOffset(this,field);
  puVar4 = (ulong *)ReflectionSchema::GetFieldDefault(this,field);
  uVar1 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  lhs_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    lhs_arena = *(Arena **)lhs_arena;
  }
  uVar1 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  rhs_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    rhs_arena = *(Arena **)rhs_arena;
  }
  SwapArenaStringPtr((string *)(*puVar4 & 0xfffffffffffffffe),
                     (ArenaStringPtr *)
                     ((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),lhs_arena,
                     (ArenaStringPtr *)
                     ((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),rhs_arena);
  return;
}

Assistant:

void SwapFieldHelper::SwapNonInlinedStrings(const Reflection* r, Message* lhs,
                                            Message* rhs,
                                            const FieldDescriptor* field) {
  ArenaStringPtr* lhs_string = r->MutableRaw<ArenaStringPtr>(lhs, field);
  ArenaStringPtr* rhs_string = r->MutableRaw<ArenaStringPtr>(rhs, field);
  if (unsafe_shallow_swap) {
    ArenaStringPtr::UnsafeShallowSwap(lhs_string, rhs_string);
  } else {
    SwapFieldHelper::SwapArenaStringPtr(
        r->DefaultRaw<ArenaStringPtr>(field).GetPointer(),  //
        lhs_string, lhs->GetArenaForAllocation(),           //
        rhs_string, rhs->GetArenaForAllocation());
  }
}